

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

void Abc_NtkDelayTraceSortPins(Abc_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  void **ppvVar4;
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  uVar8 = (pNode->vFanins).nSize;
  if (0 < (int)uVar8) {
    piVar3 = (pNode->vFanins).pArray;
    ppvVar4 = pNode->pNtk->vObjs->pArray;
    lVar12 = 0;
    do {
      plVar5 = (long *)ppvVar4[piVar3[lVar12]];
      pPinPerm[lVar12] = (int)lVar12;
      pPinDelays[lVar12] = *(float *)(*(long *)(*plVar5 + 400) + (long)(int)plVar5[2] * 0xc);
      lVar12 = lVar12 + 1;
      uVar8 = (pNode->vFanins).nSize;
      uVar6 = (ulong)(int)uVar8;
    } while (lVar12 < (long)uVar6);
    if (1 < (int)uVar8) {
      uVar7 = 1;
      uVar11 = 0;
      do {
        uVar1 = uVar11 + 1;
        if ((long)uVar1 < (long)(int)uVar6) {
          uVar10 = uVar11 & 0xffffffff;
          uVar13 = uVar7;
          do {
            uVar9 = uVar13 & 0xffffffff;
            if (pPinDelays[pPinPerm[uVar13]] < pPinDelays[pPinPerm[(int)uVar10]] ||
                pPinDelays[pPinPerm[uVar13]] == pPinDelays[pPinPerm[(int)uVar10]]) {
              uVar9 = uVar10;
            }
            uVar13 = uVar13 + 1;
            uVar8 = (uint)uVar9;
            uVar10 = uVar9;
          } while ((uVar6 & 0xffffffff) != uVar13);
        }
        else {
          uVar8 = (uint)uVar11;
        }
        if (uVar11 != uVar8) {
          iVar2 = pPinPerm[uVar11];
          pPinPerm[uVar11] = pPinPerm[(int)uVar8];
          pPinPerm[(int)uVar8] = iVar2;
          uVar6 = (ulong)(uint)(pNode->vFanins).nSize;
        }
        uVar8 = (uint)uVar6;
        uVar7 = uVar7 + 1;
        uVar11 = uVar1;
      } while ((long)uVar1 < (long)(int)(uVar8 - 1));
    }
  }
  if (uVar8 != 0) {
    if ((int)uVar8 <= *pPinPerm) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                    ,0x51,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
    }
    if (1 < (int)uVar8) {
      uVar6 = 1;
      do {
        if ((int)uVar8 <= pPinPerm[uVar6]) {
          __assert_fail("pPinPerm[i] < Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                        ,0x54,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
        }
        if (pPinDelays[pPinPerm[uVar6 - 1]] < pPinDelays[pPinPerm[uVar6]]) {
          __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcSpeedup.c"
                        ,0x55,"void Abc_NtkDelayTraceSortPins(Abc_Obj_t *, int *, float *)");
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
  }
  return;
}

Assistant:

void Abc_NtkDelayTraceSortPins( Abc_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Abc_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Abc_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Abc_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Abc_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Abc_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Abc_ObjFaninNum(pNode) );
    for ( i = 1; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Abc_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}